

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FindDegenerates.cpp
# Opt level: O2

void updateSceneGraph(aiNode *pNode,uint index)

{
  uint uVar1;
  uint i;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint i_1;
  
  for (uVar2 = 0; uVar3 = pNode->mNumMeshes, uVar2 < uVar3; uVar2 = uVar2 + 1) {
    uVar4 = (ulong)uVar2;
    uVar1 = pNode->mMeshes[uVar4];
    if (index < uVar1) {
      pNode->mMeshes[uVar4] = uVar1 - 1;
    }
    else if (uVar1 == index) {
      for (; uVar4 < uVar3 - 1; uVar4 = uVar4 + 1) {
        pNode->mMeshes[uVar4] = pNode->mMeshes[uVar4 + 1];
        uVar3 = pNode->mNumMeshes;
      }
      pNode->mNumMeshes = uVar3 - 1;
      uVar2 = uVar2 - 1;
    }
  }
  for (uVar4 = 0; uVar4 < pNode->mNumChildren; uVar4 = uVar4 + 1) {
    updateSceneGraph(pNode->mChildren[uVar4],index);
  }
  return;
}

Assistant:

static void updateSceneGraph(aiNode* pNode, unsigned const index) {
    for (unsigned i = 0; i < pNode->mNumMeshes; ++i) {
        if (pNode->mMeshes[i] > index) {
            --(pNode->mMeshes[i]);
            continue;
        }
        if (pNode->mMeshes[i] == index) {
            for (unsigned j = i; j < pNode->mNumMeshes -1; ++j) {
                pNode->mMeshes[j] = pNode->mMeshes[j+1];
            }
            --(pNode->mNumMeshes);
            --i;
            continue;
        }
    }
    //recurse to all children
    for (unsigned i = 0; i < pNode->mNumChildren; ++i) {
        updateSceneGraph(pNode->mChildren[i], index);
    }
}